

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::TimeDependency<int>::addDependencies
          (TimeDependency<int> *this,SignalArray_const<int> *ar)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uint uVar3;
  undefined8 uStack_28;
  
  uVar3 = 0;
  uStack_28 = in_RAX;
  while( true ) {
    uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
    uVar1 = (*ar->_vptr_SignalArray_const[4])(ar);
    if (uVar1 <= uVar3) break;
    iVar2 = (*ar->_vptr_SignalArray_const[3])(ar,(long)&uStack_28 + 4);
    addDependency(this,(SignalBase<int> *)CONCAT44(extraout_var,iVar2));
    uVar3 = uStack_28._4_4_ + 1;
  }
  return;
}

Assistant:

void TimeDependency<Time>::addDependencies(const SignalArray_const<Time> &ar) {
  for (unsigned int i = 0; i < ar.getSize(); ++i) {
    addDependency(ar[i]);
  }
}